

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O2

void Gia_ManProfileCollect
               (Gia_Man_t *p,int i,Vec_Int_t *vCode,Vec_Int_t *vCodeOffsets,Vec_Int_t *vArray)

{
  int i_00;
  int iVar1;
  
  vArray->nSize = 0;
  i_00 = Vec_IntEntry(vCodeOffsets,i);
  while( true ) {
    iVar1 = Vec_IntEntry(vCodeOffsets,i + 1);
    if (iVar1 <= i_00) break;
    iVar1 = Vec_IntEntry(vCode,i_00);
    Vec_IntPush(vArray,iVar1);
    i_00 = i_00 + 1;
  }
  return;
}

Assistant:

void Gia_ManProfileCollect( Gia_Man_t * p, int i, Vec_Int_t * vCode, Vec_Int_t * vCodeOffsets, Vec_Int_t * vArray )
{
    int k;
    Vec_IntClear( vArray );
    for ( k = Vec_IntEntry(vCodeOffsets, i); k < Vec_IntEntry(vCodeOffsets, i+1); k++ )
        Vec_IntPush( vArray, Vec_IntEntry(vCode, k) );
}